

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O3

void __thiscall QProgressBar::setFormat(QProgressBar *this,QString *format)

{
  long lVar1;
  long lVar2;
  char cVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = *(long *)(lVar1 + 0x288);
  if (lVar2 == (format->d).size) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x280);
    QVar4.m_size = lVar2;
    QVar5.m_data = (format->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') {
      return;
    }
  }
  QString::operator=((QString *)(lVar1 + 0x278),(QString *)format);
  *(byte *)(lVar1 + 0x264) = *(byte *)(lVar1 + 0x264) & 0xfd;
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

void QProgressBar::setFormat(const QString &format)
{
    Q_D(QProgressBar);
    if (d->format == format)
        return;
    d->format = format;
    d->defaultFormat = false;
    update();
}